

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O0

void msgpack::v1::StdTupleConverter<std::tuple<int,_empty_obj>_&,_2UL>::convert
               (object *o,tuple<int,_empty_obj> *v)

{
  empty_obj *v_00;
  object *in_RSI;
  long in_RDI;
  tuple<int,_empty_obj> *in_stack_ffffffffffffffe8;
  
  StdTupleConverter<std::tuple<int,_empty_obj>_&,_1UL>::convert(in_RSI,in_stack_ffffffffffffffe8);
  if (1 < *(uint *)(in_RDI + 8)) {
    v_00 = (empty_obj *)(*(long *)(in_RDI + 0x10) + 0x18);
    std::get<1ul,int,empty_obj>((tuple<int,_empty_obj> *)0x2a3cf6);
    v2::object::convert<empty_obj>(in_RSI,v_00);
  }
  return;
}

Assistant:

static void convert(
        msgpack::object const& o,
        Tuple& v) {
        StdTupleConverter<Tuple, N-1>::convert(o, v);
        if (o.via.array.size >= N)
            o.via.array.ptr[N-1].convert<typename std::remove_reference<decltype(std::get<N-1>(v))>::type>(std::get<N-1>(v));
    }